

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O1

void __thiscall adios2::format::DataManSerializer::GetAttributes(DataManSerializer *this,IO *io)

{
  longdouble lVar1;
  char *pcVar2;
  complex<float> *array;
  uchar *array_00;
  complex<double> *array_01;
  double *array_02;
  int *array_03;
  long *array_04;
  unsigned_long *array_05;
  short *array_06;
  unsigned_short *array_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *array_08;
  uint *array_09;
  longdouble *array_10;
  float *array_11;
  bool bVar3;
  int iVar4;
  DataType DVar5;
  reference this_00;
  reference this_01;
  const_reference pvVar6;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var7;
  const_iterator cVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  undefined1 *puVar12;
  size_t sVar13;
  long lVar14;
  ScopedTimer __var2117;
  iterator __end2;
  iterator __begin2;
  string local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  IO *local_488;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_480;
  string local_468;
  pthread_mutex_t *local_440;
  ScopedTimer local_438;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_430;
  iterator local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_488 = io;
  if ((GetAttributes(adios2::core::IO&)::__var117 == '\0') &&
     (iVar4 = __cxa_guard_acquire(&GetAttributes(adios2::core::IO&)::__var117), iVar4 != 0)) {
    uVar10 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                 ,
                                 "void adios2::format::DataManSerializer::GetAttributes(core::IO &)"
                                 ,0x75);
    GetAttributes::__var117 = (void *)ps_timer_create_(uVar10);
    __cxa_guard_release(&GetAttributes(adios2::core::IO&)::__var117);
  }
  local_438.m_timer = GetAttributes::__var117;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_440 = (pthread_mutex_t *)&this->m_StaticDataJsonMutex;
  iVar4 = pthread_mutex_lock(local_440);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  this_00 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)&this->m_StaticDataJson,"S");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin(&local_410,this_00);
  local_430.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_430.m_it.array_iterator._M_current = (pointer)0x0;
  local_430.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (this_00->m_type == array) {
    local_430.m_it.array_iterator._M_current =
         (((this_00->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (this_00->m_type == object) {
    local_430.m_it.object_iterator._M_node =
         &(((this_00->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_430.m_it.primitive_iterator.m_it = 1;
  }
  local_430.m_object = this_00;
  do {
    bVar3 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_410,&local_430);
    if (bVar3) {
      pthread_mutex_unlock(local_440);
      external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_438);
      return;
    }
    this_01 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&local_410);
    pvVar6 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)this_01,"Y");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_4c8,pvVar6);
    DVar5 = helper::GetDataTypeFromString(&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
        &local_4c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p));
    }
    switch(DVar5) {
    case Int8:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p == '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          local_4a8._M_dataplus._M_p._0_1_ = 0;
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_signed_char,_0>
                    (pvVar6,(char *)&local_4a8);
          local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/","");
          core::IO::DefineAttribute<signed_char>
                    (local_488,&local_4c8,(char *)&local_468,&local_4a8,&local_d0,false);
          paVar9 = &local_d0.field_2;
          _Var11._M_p = local_d0._M_dataplus._M_p;
          goto LAB_0068057d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::get_impl<std::vector<signed_char,_std::allocator<signed_char>_>,_0>(&local_468,pvVar6);
        pcVar2 = (char *)CONCAT44(local_468._M_dataplus._M_p._4_4_,
                                  CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                           CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                    local_468._M_dataplus._M_p._0_1_)));
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::get_impl<std::vector<signed_char,_std::allocator<signed_char>_>,_0>(&local_480,pvVar6);
        sVar13 = (long)local_480.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_480.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/","");
        core::IO::DefineAttribute<signed_char>
                  (local_488,&local_4c8,pcVar2,sVar13,&local_4a8,&local_f0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        puVar12 = (undefined1 *)
                  CONCAT44(local_4a8._M_dataplus._M_p._4_4_,
                           CONCAT22(local_4a8._M_dataplus._M_p._2_2_,
                                    CONCAT11(local_4a8._M_dataplus._M_p._1_1_,
                                             local_4a8._M_dataplus._M_p._0_1_)));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12 != &local_4a8.field_2) {
LAB_00681356:
          operator_delete(puVar12);
        }
LAB_0068135b:
        if (local_480.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_480.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        puVar12 = (undefined1 *)
                  CONCAT44(local_468._M_dataplus._M_p._4_4_,
                           CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                    CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                             local_468._M_dataplus._M_p._0_1_)));
        if (puVar12 == (undefined1 *)0x0) goto LAB_00681379;
LAB_00681374:
        operator_delete(puVar12);
LAB_00681379:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
            &local_4c8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p
                                  ));
        }
      }
      break;
    case Int16:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<short,_std::allocator<short>_>,_0>(&local_468,pvVar6);
          array_06 = (short *)CONCAT44(local_468._M_dataplus._M_p._4_4_,
                                       CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                                CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                         local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<short,_std::allocator<short>_>,_0>(&local_480,pvVar6);
          lVar14 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"/","");
          core::IO::DefineAttribute<short>
                    (local_488,&local_4c8,array_06,lVar14 >> 1,&local_4a8,&local_130,false);
          paVar9 = &local_130.field_2;
          _Var11._M_p = local_130._M_dataplus._M_p;
LAB_0068133d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var11._M_p != paVar9) {
            operator_delete(_Var11._M_p);
          }
          puVar12 = (undefined1 *)
                    CONCAT44(local_4a8._M_dataplus._M_p._4_4_,
                             CONCAT22(local_4a8._M_dataplus._M_p._2_2_,
                                      CONCAT11(local_4a8._M_dataplus._M_p._1_1_,
                                               local_4a8._M_dataplus._M_p._0_1_)));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12 != &local_4a8.field_2) goto LAB_00681356;
          goto LAB_0068135b;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        local_4a8._M_dataplus._M_p._1_1_ = 0;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_short,_0>
                  (pvVar6,(short *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        local_468._M_dataplus._M_p._1_1_ = local_4a8._M_dataplus._M_p._1_1_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/","");
        core::IO::DefineAttribute<short>
                  (local_488,&local_4c8,(short *)&local_468,&local_4a8,&local_110,false);
        paVar9 = &local_110.field_2;
        _Var11._M_p = local_110._M_dataplus._M_p;
LAB_0068057d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var11._M_p != paVar9) {
          operator_delete(_Var11._M_p);
        }
        puVar12 = (undefined1 *)
                  CONCAT44(local_4a8._M_dataplus._M_p._4_4_,
                           CONCAT22(local_4a8._M_dataplus._M_p._2_2_,
                                    CONCAT11(local_4a8._M_dataplus._M_p._1_1_,
                                             local_4a8._M_dataplus._M_p._0_1_)));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12 != &local_4a8.field_2) goto LAB_00681374;
        goto LAB_00681379;
      }
      break;
    case Int32:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<int,_std::allocator<int>_>,_0>(&local_468,pvVar6);
          array_03 = (int *)CONCAT44(local_468._M_dataplus._M_p._4_4_,
                                     CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                              CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                       local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<int,_std::allocator<int>_>,_0>(&local_480,pvVar6);
          lVar14 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"/","");
          core::IO::DefineAttribute<int>
                    (local_488,&local_4c8,array_03,lVar14 >> 2,&local_4a8,&local_170,false);
          paVar9 = &local_170.field_2;
          _Var11._M_p = local_170._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        local_4a8._M_dataplus._M_p._1_1_ = 0;
        local_4a8._M_dataplus._M_p._2_2_ = 0;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                  (pvVar6,(int *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        local_468._M_dataplus._M_p._1_1_ = local_4a8._M_dataplus._M_p._1_1_;
        local_468._M_dataplus._M_p._2_2_ = local_4a8._M_dataplus._M_p._2_2_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"/","");
        core::IO::DefineAttribute<int>
                  (local_488,&local_4c8,(int *)&local_468,&local_4a8,&local_150,false);
        paVar9 = &local_150.field_2;
        _Var11._M_p = local_150._M_dataplus._M_p;
        goto LAB_0068057d;
      }
      break;
    case Int64:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<long,_std::allocator<long>_>,_0>(&local_468,pvVar6);
          array_04 = (long *)CONCAT44(local_468._M_dataplus._M_p._4_4_,
                                      CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                               CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                        local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<long,_std::allocator<long>_>,_0>(&local_480,pvVar6);
          lVar14 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/","");
          core::IO::DefineAttribute<long>
                    (local_488,&local_4c8,array_04,lVar14 >> 3,&local_4a8,&local_1b0,false);
          paVar9 = &local_1b0.field_2;
          _Var11._M_p = local_1b0._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        local_4a8._M_dataplus._M_p._1_1_ = 0;
        local_4a8._M_dataplus._M_p._2_2_ = 0;
        local_4a8._M_dataplus._M_p._4_4_ = 0;
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                  (pvVar6,(long *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        local_468._M_dataplus._M_p._1_1_ = local_4a8._M_dataplus._M_p._1_1_;
        local_468._M_dataplus._M_p._2_2_ = local_4a8._M_dataplus._M_p._2_2_;
        local_468._M_dataplus._M_p._4_4_ = local_4a8._M_dataplus._M_p._4_4_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"/","");
        core::IO::DefineAttribute<long>
                  (local_488,&local_4c8,(long *)&local_468,&local_4a8,&local_190,false);
        paVar9 = &local_190.field_2;
        _Var11._M_p = local_190._M_dataplus._M_p;
        goto LAB_0068057d;
      }
      break;
    case UInt8:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_0>
                    (&local_468,pvVar6);
          array_00 = (uchar *)CONCAT44(local_468._M_dataplus._M_p._4_4_,
                                       CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                                CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                         local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_0>
                    (&local_480,pvVar6);
          sVar13 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/","");
          core::IO::DefineAttribute<unsigned_char>
                    (local_488,&local_4c8,array_00,sVar13,&local_4a8,&local_1f0,false);
          paVar9 = &local_1f0.field_2;
          _Var11._M_p = local_1f0._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
                  (pvVar6,(uchar *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"/","");
        core::IO::DefineAttribute<unsigned_char>
                  (local_488,&local_4c8,(uchar *)&local_468,&local_4a8,&local_1d0,false);
        paVar9 = &local_1d0.field_2;
        _Var11._M_p = local_1d0._M_dataplus._M_p;
        goto LAB_0068057d;
      }
      break;
    case UInt16:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_0>
                    (&local_468,pvVar6);
          array_07 = (unsigned_short *)
                     CONCAT44(local_468._M_dataplus._M_p._4_4_,
                              CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_0>
                    (&local_480,pvVar6);
          lVar14 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"/","");
          core::IO::DefineAttribute<unsigned_short>
                    (local_488,&local_4c8,array_07,lVar14 >> 1,&local_4a8,&local_230,false);
          paVar9 = &local_230.field_2;
          _Var11._M_p = local_230._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        local_4a8._M_dataplus._M_p._1_1_ = 0;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_short,_0>
                  (pvVar6,(unsigned_short *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        local_468._M_dataplus._M_p._1_1_ = local_4a8._M_dataplus._M_p._1_1_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/","");
        core::IO::DefineAttribute<unsigned_short>
                  (local_488,&local_4c8,(unsigned_short *)&local_468,&local_4a8,&local_210,false);
        paVar9 = &local_210.field_2;
        _Var11._M_p = local_210._M_dataplus._M_p;
        goto LAB_0068057d;
      }
      break;
    case UInt32:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_0>(&local_468,pvVar6)
          ;
          array_09 = (uint *)CONCAT44(local_468._M_dataplus._M_p._4_4_,
                                      CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                               CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                        local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_0>(&local_480,pvVar6)
          ;
          lVar14 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"/","");
          core::IO::DefineAttribute<unsigned_int>
                    (local_488,&local_4c8,array_09,lVar14 >> 2,&local_4a8,&local_270,false);
          paVar9 = &local_270.field_2;
          _Var11._M_p = local_270._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        local_4a8._M_dataplus._M_p._1_1_ = 0;
        local_4a8._M_dataplus._M_p._2_2_ = 0;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_int,_0>
                  (pvVar6,(uint *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        local_468._M_dataplus._M_p._1_1_ = local_4a8._M_dataplus._M_p._1_1_;
        local_468._M_dataplus._M_p._2_2_ = local_4a8._M_dataplus._M_p._2_2_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"/","");
        core::IO::DefineAttribute<unsigned_int>
                  (local_488,&local_4c8,(uint *)&local_468,&local_4a8,&local_250,false);
        paVar9 = &local_250.field_2;
        _Var11._M_p = local_250._M_dataplus._M_p;
        goto LAB_0068057d;
      }
      break;
    case UInt64:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_0>
                    (&local_468,pvVar6);
          array_05 = (unsigned_long *)
                     CONCAT44(local_468._M_dataplus._M_p._4_4_,
                              CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_0>
                    (&local_480,pvVar6);
          lVar14 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"/","");
          core::IO::DefineAttribute<unsigned_long>
                    (local_488,&local_4c8,array_05,lVar14 >> 3,&local_4a8,&local_2b0,false);
          paVar9 = &local_2b0.field_2;
          _Var11._M_p = local_2b0._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        local_4a8._M_dataplus._M_p._1_1_ = 0;
        local_4a8._M_dataplus._M_p._2_2_ = 0;
        local_4a8._M_dataplus._M_p._4_4_ = 0;
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                  (pvVar6,(unsigned_long *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        local_468._M_dataplus._M_p._1_1_ = local_4a8._M_dataplus._M_p._1_1_;
        local_468._M_dataplus._M_p._2_2_ = local_4a8._M_dataplus._M_p._2_2_;
        local_468._M_dataplus._M_p._4_4_ = local_4a8._M_dataplus._M_p._4_4_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"/","");
        core::IO::DefineAttribute<unsigned_long>
                  (local_488,&local_4c8,(unsigned_long *)&local_468,&local_4a8,&local_290,false);
        paVar9 = &local_290.field_2;
        _Var11._M_p = local_290._M_dataplus._M_p;
        goto LAB_0068057d;
      }
      break;
    case Float:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<float,_std::allocator<float>_>,_0>(&local_468,pvVar6);
          array_11 = (float *)CONCAT44(local_468._M_dataplus._M_p._4_4_,
                                       CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                                CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                         local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<float,_std::allocator<float>_>,_0>(&local_480,pvVar6);
          lVar14 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"/","");
          core::IO::DefineAttribute<float>
                    (local_488,&local_4c8,array_11,lVar14 >> 2,&local_4a8,&local_2f0,false);
          paVar9 = &local_2f0.field_2;
          _Var11._M_p = local_2f0._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        local_4a8._M_dataplus._M_p._1_1_ = 0;
        local_4a8._M_dataplus._M_p._2_2_ = 0;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_float,_0>
                  (pvVar6,(float *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        local_468._M_dataplus._M_p._1_1_ = local_4a8._M_dataplus._M_p._1_1_;
        local_468._M_dataplus._M_p._2_2_ = local_4a8._M_dataplus._M_p._2_2_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"/","");
        core::IO::DefineAttribute<float>
                  (local_488,&local_4c8,(float *)&local_468,&local_4a8,&local_2d0,false);
        paVar9 = &local_2d0.field_2;
        _Var11._M_p = local_2d0._M_dataplus._M_p;
        goto LAB_0068057d;
      }
      break;
    case Double:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<double,_std::allocator<double>_>,_0>(&local_468,pvVar6);
          array_02 = (double *)
                     CONCAT44(local_468._M_dataplus._M_p._4_4_,
                              CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<double,_std::allocator<double>_>,_0>(&local_480,pvVar6);
          lVar14 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"/","");
          core::IO::DefineAttribute<double>
                    (local_488,&local_4c8,array_02,lVar14 >> 3,&local_4a8,&local_330,false);
          paVar9 = &local_330.field_2;
          _Var11._M_p = local_330._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        local_4a8._M_dataplus._M_p._1_1_ = 0;
        local_4a8._M_dataplus._M_p._2_2_ = 0;
        local_4a8._M_dataplus._M_p._4_4_ = 0;
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                  (pvVar6,(double *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        local_468._M_dataplus._M_p._1_1_ = local_4a8._M_dataplus._M_p._1_1_;
        local_468._M_dataplus._M_p._2_2_ = local_4a8._M_dataplus._M_p._2_2_;
        local_468._M_dataplus._M_p._4_4_ = local_4a8._M_dataplus._M_p._4_4_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"/","");
        core::IO::DefineAttribute<double>
                  (local_488,&local_4c8,(double *)&local_468,&local_4a8,&local_310,false);
        paVar9 = &local_310.field_2;
        _Var11._M_p = local_310._M_dataplus._M_p;
        goto LAB_0068057d;
      }
      break;
    case LongDouble:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<long_double,_std::allocator<long_double>_>,_0>(&local_468,pvVar6);
          array_10 = (longdouble *)
                     CONCAT44(local_468._M_dataplus._M_p._4_4_,
                              CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<long_double,_std::allocator<long_double>_>,_0>(&local_480,pvVar6);
          lVar14 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"/","");
          core::IO::DefineAttribute<long_double>
                    (local_488,&local_4c8,array_10,lVar14 >> 4,&local_4a8,&local_370,false);
          paVar9 = &local_370.field_2;
          _Var11._M_p = local_370._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        lVar1 = (longdouble)0;
        local_4a8._M_dataplus._M_p._0_1_ = SUB101(lVar1,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((unkuint10)lVar1 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((unkuint10)lVar1 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((unkuint10)lVar1 >> 0x20);
        local_4a8._M_string_length._0_2_ = (undefined2)((unkuint10)lVar1 >> 0x40);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long_double,_0>
                  (pvVar6,(longdouble *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        local_468._M_dataplus._M_p._1_1_ = local_4a8._M_dataplus._M_p._1_1_;
        local_468._M_dataplus._M_p._2_2_ = local_4a8._M_dataplus._M_p._2_2_;
        local_468._M_dataplus._M_p._4_4_ = local_4a8._M_dataplus._M_p._4_4_;
        local_468._M_string_length._0_2_ = (undefined2)local_4a8._M_string_length;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"/","");
        core::IO::DefineAttribute<long_double>
                  (local_488,&local_4c8,(longdouble *)&local_468,&local_4a8,&local_350,false);
        paVar9 = &local_350.field_2;
        _Var11._M_p = local_350._M_dataplus._M_p;
        goto LAB_0068057d;
      }
      break;
    case FloatComplex:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_0>
                    (&local_468,pvVar6);
          array = (complex<float> *)
                  CONCAT44(local_468._M_dataplus._M_p._4_4_,
                           CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                    CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                             local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_0>
                    (&local_480,pvVar6);
          lVar14 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"/","");
          core::IO::DefineAttribute<std::complex<float>>
                    (local_488,&local_4c8,array,lVar14 >> 3,&local_4a8,&local_3b0,false);
          paVar9 = &local_3b0.field_2;
          _Var11._M_p = local_3b0._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        local_4a8._M_dataplus._M_p._1_1_ = 0;
        local_4a8._M_dataplus._M_p._2_2_ = 0;
        local_4a8._M_dataplus._M_p._4_4_ = 0;
        nlohmann::detail::from_json_fn::operator()
                  ((from_json_fn *)
                   &nlohmann::detail::static_const<nlohmann::detail::from_json_fn>::value,pvVar6,
                   (complex<float> *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        local_468._M_dataplus._M_p._1_1_ = local_4a8._M_dataplus._M_p._1_1_;
        local_468._M_dataplus._M_p._2_2_ = local_4a8._M_dataplus._M_p._2_2_;
        local_468._M_dataplus._M_p._4_4_ = local_4a8._M_dataplus._M_p._4_4_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"/","");
        core::IO::DefineAttribute<std::complex<float>>
                  (local_488,&local_4c8,(complex<float> *)&local_468,&local_4a8,&local_390,false);
        paVar9 = &local_390.field_2;
        _Var11._M_p = local_390._M_dataplus._M_p;
        goto LAB_0068057d;
      }
      break;
    case DoubleComplex:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_0>
                    (&local_468,pvVar6);
          array_01 = (complex<double> *)
                     CONCAT44(local_468._M_dataplus._M_p._4_4_,
                              CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_0>
                    (&local_480,pvVar6);
          lVar14 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"/","");
          core::IO::DefineAttribute<std::complex<double>>
                    (local_488,&local_4c8,array_01,lVar14 >> 4,&local_4a8,&local_3f0,false);
          paVar9 = &local_3f0.field_2;
          _Var11._M_p = local_3f0._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        local_4a8._M_dataplus._M_p._1_1_ = 0;
        local_4a8._M_dataplus._M_p._2_2_ = 0;
        local_4a8._M_dataplus._M_p._4_4_ = 0;
        local_4a8._M_string_length._0_2_ = 0;
        local_4a8._M_string_length._2_2_ = 0;
        local_4a8._M_string_length._4_4_ = 0;
        nlohmann::detail::from_json_fn::operator()
                  ((from_json_fn *)
                   &nlohmann::detail::static_const<nlohmann::detail::from_json_fn>::value,pvVar6,
                   (complex<double> *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        local_468._M_dataplus._M_p._1_1_ = local_4a8._M_dataplus._M_p._1_1_;
        local_468._M_dataplus._M_p._2_2_ = local_4a8._M_dataplus._M_p._2_2_;
        local_468._M_dataplus._M_p._4_4_ = local_4a8._M_dataplus._M_p._4_4_;
        local_468._M_string_length._0_2_ = (undefined2)local_4a8._M_string_length;
        local_468._M_string_length._2_2_ = local_4a8._M_string_length._2_2_;
        local_468._M_string_length._4_4_ = local_4a8._M_string_length._4_4_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"/","");
        core::IO::DefineAttribute<std::complex<double>>
                  (local_488,&local_4c8,(complex<double> *)&local_468,&local_4a8,&local_3d0,false);
        paVar9 = &local_3d0.field_2;
        _Var11._M_p = local_3d0._M_dataplus._M_p;
        goto LAB_0068057d;
      }
      break;
    case String:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p == '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4a8,pvVar6);
          paVar9 = &local_468.field_2;
          local_468._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_468._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_468._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_468._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/","");
          core::IO::DefineAttribute<std::__cxx11::string>
                    (local_488,&local_4c8,&local_4a8,&local_468,&local_50,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          _Var11._M_p = (pointer)CONCAT44(local_468._M_dataplus._M_p._4_4_,
                                          CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                                   CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                            local_468._M_dataplus._M_p._0_1_)));
          paVar9 = &local_468.field_2;
          goto LAB_0068057d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  (&local_468,pvVar6);
        array_08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(local_468._M_dataplus._M_p._4_4_,
                            CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                     CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                              local_468._M_dataplus._M_p._0_1_)));
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  (&local_480,pvVar6);
        lVar14 = (long)local_480.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_480.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/","");
        core::IO::DefineAttribute<std::__cxx11::string>
                  (local_488,&local_4c8,array_08,lVar14 >> 5,&local_4a8,&local_70,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        puVar12 = (undefined1 *)
                  CONCAT44(local_4a8._M_dataplus._M_p._4_4_,
                           CONCAT22(local_4a8._M_dataplus._M_p._2_2_,
                                    CONCAT11(local_4a8._M_dataplus._M_p._1_1_,
                                             local_4a8._M_dataplus._M_p._0_1_)));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12 != &local_4a8.field_2) {
          operator_delete(puVar12);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_480);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_468);
        goto LAB_00681379;
      }
      break;
    case Char:
      p_Var7 = &core::IO::GetAttributes_abi_cxx11_(local_488)->_M_h;
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"N");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_4c8,pvVar6);
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(p_Var7,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
          &local_4c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p))
        ;
      }
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"V");
        local_4c8._M_dataplus._M_p._0_1_ = '\0';
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar6,(boolean_t *)&local_4c8);
        if ((char)local_4c8._M_dataplus._M_p != '\x01') {
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"N");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_4c8,pvVar6);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<char,_std::allocator<char>_>,_0>(&local_468,pvVar6);
          pcVar2 = (char *)CONCAT44(local_468._M_dataplus._M_p._4_4_,
                                    CONCAT22(local_468._M_dataplus._M_p._2_2_,
                                             CONCAT11(local_468._M_dataplus._M_p._1_1_,
                                                      local_468._M_dataplus._M_p._0_1_)));
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"G");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<char,_std::allocator<char>_>,_0>(&local_480,pvVar6);
          sVar13 = (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_480.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          paVar9 = &local_4a8.field_2;
          local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
          local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
          local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
          local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/","");
          core::IO::DefineAttribute<char>
                    (local_488,&local_4c8,pcVar2,sVar13,&local_4a8,&local_b0,false);
          paVar9 = &local_b0.field_2;
          _Var11._M_p = local_b0._M_dataplus._M_p;
          goto LAB_0068133d;
        }
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"N");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_4c8,pvVar6);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_01,"G");
        local_4a8._M_dataplus._M_p._0_1_ = 0;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char,_0>
                  (pvVar6,(char *)&local_4a8);
        local_468._M_dataplus._M_p._0_1_ = local_4a8._M_dataplus._M_p._0_1_;
        paVar9 = &local_4a8.field_2;
        local_4a8._M_dataplus._M_p._0_1_ = SUB81(paVar9,0);
        local_4a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar9 >> 8);
        local_4a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar9 >> 0x10);
        local_4a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar9 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/","");
        core::IO::DefineAttribute<char>
                  (local_488,&local_4c8,(char *)&local_468,&local_4a8,&local_90,false);
        paVar9 = &local_90.field_2;
        _Var11._M_p = local_90._M_dataplus._M_p;
        goto LAB_0068057d;
      }
    }
    if ((local_410.m_object)->m_type == array) {
      local_410.m_it.array_iterator._M_current = local_410.m_it.array_iterator._M_current + 1;
    }
    else if ((local_410.m_object)->m_type == object) {
      local_410.m_it.object_iterator._M_node =
           (_Base_ptr)std::_Rb_tree_increment(local_410.m_it.object_iterator._M_node);
    }
    else {
      local_410.m_it.primitive_iterator.m_it = local_410.m_it.primitive_iterator.m_it + 1;
    }
  } while( true );
}

Assistant:

void DataManSerializer::GetAttributes(core::IO &io)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    std::lock_guard<std::mutex> lStaticDataJson(m_StaticDataJsonMutex);
    for (const auto &staticVar : m_StaticDataJson["S"])
    {
        const DataType type(helper::GetDataTypeFromString(staticVar["Y"].get<std::string>()));
        if (type == DataType::None)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        const auto &attributes = io.GetAttributes();                                               \
        auto it = attributes.find(staticVar["N"].get<std::string>());                              \
        if (it == attributes.end())                                                                \
        {                                                                                          \
            if (staticVar["V"].get<bool>())                                                        \
            {                                                                                      \
                io.DefineAttribute<T>(staticVar["N"].get<std::string>(), staticVar["G"].get<T>()); \
            }                                                                                      \
            else                                                                                   \
            {                                                                                      \
                io.DefineAttribute<T>(staticVar["N"].get<std::string>(),                           \
                                      staticVar["G"].get<std::vector<T>>().data(),                 \
                                      staticVar["G"].get<std::vector<T>>().size());                \
            }                                                                                      \
        }                                                                                          \
    }
        ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_type)
#undef declare_type
    }
}